

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  ulong in_RAX;
  ostream *poVar2;
  ulong uStack_18;
  Colour colour;
  
  uStack_18 = in_RAX;
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam0000000000206200 = 0x7e7e7e7e7e7e7e;
    uRam0000000000206207 = 0x7e7e7e7e7e7e7e7e;
    _DAT_002061f0 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000002061f8 = 0x7e7e7e7e7e7e7e;
    DAT_002061ff = 0x7e;
    _DAT_002061e0 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000002061e8 = 0x7e7e7e7e7e7e7e7e;
    _DAT_002061d0 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000002061d8 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam00000000002061c8 = 0x7e7e7e7e7e7e7e7e;
    DAT_0020620f = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           (string *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           currentTestRunInfo.super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  libraryVersion();
  Catch::operator<<(poVar2,&libraryVersion::version);
  poVar2 = std::operator<<(poVar2," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n\n");
  }
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used = true;
  Colour::~Colour(&colour);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}